

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGlobalGenerator.cxx
# Opt level: O2

void __thiscall cmGlobalGenerator::Configure(cmGlobalGenerator *this)

{
  cmake *pcVar1;
  pointer puVar2;
  _func_int **pp_Var3;
  _func_int *p_Var4;
  pointer pGVar5;
  bool bVar6;
  long lVar7;
  string *psVar8;
  long lVar9;
  ostream *poVar10;
  unique_ptr<cmMakefile,_std::default_delete<cmMakefile>_> *mf;
  pointer puVar11;
  GlobalTargetInfo *globalTarget;
  GlobalTargetInfo *gti;
  allocator<char> local_222;
  allocator<char> local_221;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_220;
  __single_object dirMfu;
  cmConstStack<cmListFileContext,_cmListFileBacktrace> local_1f8 [2];
  long local_1d0;
  vector<cmGlobalGenerator::GlobalTargetInfo,_std::allocator<cmGlobalGenerator::GlobalTargetInfo>_>
  globalTargets;
  cmStateSnapshot snapshot;
  
  lVar7 = std::chrono::_V2::steady_clock::now();
  this->FirstTimeProgress = 0.0;
  ClearGeneratorMembers(this);
  this->NextDeferId = 0;
  pcVar1 = this->CMakeInstance;
  snapshot.Position.Position = (pcVar1->CurrentSnapshot).Position.Position;
  snapshot.State = (pcVar1->CurrentSnapshot).State;
  snapshot.Position.Tree = (pcVar1->CurrentSnapshot).Position.Tree;
  cmStateSnapshot::GetDirectory((cmStateDirectory *)&globalTargets,&snapshot);
  psVar8 = cmake::GetHomeDirectory_abi_cxx11_(this->CMakeInstance);
  cmStateDirectory::SetCurrentSource((cmStateDirectory *)&globalTargets,psVar8);
  cmStateSnapshot::GetDirectory((cmStateDirectory *)&globalTargets,&snapshot);
  psVar8 = cmake::GetHomeOutputDirectory_abi_cxx11_(this->CMakeInstance);
  cmStateDirectory::SetCurrentBinary((cmStateDirectory *)&globalTargets,psVar8);
  globalTargets.
  super__Vector_base<cmGlobalGenerator::GlobalTargetInfo,_std::allocator<cmGlobalGenerator::GlobalTargetInfo>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)this;
  std::make_unique<cmMakefile,cmGlobalGenerator*,cmStateSnapshot&>
            ((cmGlobalGenerator **)&dirMfu,(cmStateSnapshot *)&globalTargets);
  std::
  vector<std::unique_ptr<cmMakefile,std::default_delete<cmMakefile>>,std::allocator<std::unique_ptr<cmMakefile,std::default_delete<cmMakefile>>>>
  ::emplace_back<std::unique_ptr<cmMakefile,std::default_delete<cmMakefile>>>
            ((vector<std::unique_ptr<cmMakefile,std::default_delete<cmMakefile>>,std::allocator<std::unique_ptr<cmMakefile,std::default_delete<cmMakefile>>>>
              *)&this->Makefiles,&dirMfu);
  cmMakefile::SetRecursionDepth
            ((cmMakefile *)
             dirMfu._M_t.super___uniq_ptr_impl<cmMakefile,_std::default_delete<cmMakefile>_>._M_t.
             super__Tuple_impl<0UL,_cmMakefile_*,_std::default_delete<cmMakefile>_>.
             super__Head_base<0UL,_cmMakefile_*,_false>._M_head_impl,this->RecursionDepth);
  IndexMakefile(this,(cmMakefile *)
                     dirMfu._M_t.super___uniq_ptr_impl<cmMakefile,_std::default_delete<cmMakefile>_>
                     ._M_t.super__Tuple_impl<0UL,_cmMakefile_*,_std::default_delete<cmMakefile>_>.
                     super__Head_base<0UL,_cmMakefile_*,_false>._M_head_impl);
  psVar8 = cmake::GetHomeOutputDirectory_abi_cxx11_(this->CMakeInstance);
  std::
  _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
  ::_M_insert_unique<std::__cxx11::string_const&>
            ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
              *)&this->BinaryDirectories,psVar8);
  if (((this->ExtraGenerator)._M_t.
       super___uniq_ptr_impl<cmExternalMakefileProjectGenerator,_std::default_delete<cmExternalMakefileProjectGenerator>_>
       ._M_t.
       super__Tuple_impl<0UL,_cmExternalMakefileProjectGenerator_*,_std::default_delete<cmExternalMakefileProjectGenerator>_>
       .super__Head_base<0UL,_cmExternalMakefileProjectGenerator_*,_false>._M_head_impl !=
       (cmExternalMakefileProjectGenerator *)0x0) &&
     (bVar6 = cmake::GetIsInTryCompile(this->CMakeInstance), !bVar6)) {
    pcVar1 = this->CMakeInstance;
    std::__cxx11::string::string
              ((string *)&local_220,
               (string *)
               &((this->ExtraGenerator)._M_t.
                 super___uniq_ptr_impl<cmExternalMakefileProjectGenerator,_std::default_delete<cmExternalMakefileProjectGenerator>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_cmExternalMakefileProjectGenerator_*,_std::default_delete<cmExternalMakefileProjectGenerator>_>
                 .super__Head_base<0UL,_cmExternalMakefileProjectGenerator_*,_false>._M_head_impl)->
                Name);
    cmStrCat<char_const(&)[39],std::__cxx11::string,char_const(&)[148]>
              ((string *)&globalTargets,(char (*) [39])"Support for \"Extra Generators\" like\n  ",
               &local_220,
               (char (*) [148])
               "\nis deprecated and will be removed from a future version of CMake.  IDEs may use the cmake-file-api(7) to view CMake-generated project build trees."
              );
    local_1f8[0].TopEntry.
    super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
    ._M_ptr = (element_type *)0x0;
    local_1f8[0].TopEntry.
    super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
    ._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    cmConstStack<cmListFileContext,_cmListFileBacktrace>::cmConstStack(local_1f8);
    cmake::IssueMessage(pcVar1,DEPRECATION_WARNING,(string *)&globalTargets,
                        (cmListFileBacktrace *)local_1f8);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&local_1f8[0].TopEntry.
                super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
                ._M_refcount);
    std::__cxx11::string::~string((string *)&globalTargets);
    std::__cxx11::string::~string((string *)&local_220);
  }
  this->ConfigureDoneCMP0026AndCMP0024 = false;
  cmMakefile::Configure
            ((cmMakefile *)
             dirMfu._M_t.super___uniq_ptr_impl<cmMakefile,_std::default_delete<cmMakefile>_>._M_t.
             super__Tuple_impl<0UL,_cmMakefile_*,_std::default_delete<cmMakefile>_>.
             super__Head_base<0UL,_cmMakefile_*,_false>._M_head_impl);
  cmMakefile::EnforceDirectoryLevelRules
            ((cmMakefile *)
             dirMfu._M_t.super___uniq_ptr_impl<cmMakefile,_std::default_delete<cmMakefile>_>._M_t.
             super__Tuple_impl<0UL,_cmMakefile_*,_std::default_delete<cmMakefile>_>.
             super__Head_base<0UL,_cmMakefile_*,_false>._M_head_impl);
  this->ConfigureDoneCMP0026AndCMP0024 = true;
  globalTargets.
  super__Vector_base<cmGlobalGenerator::GlobalTargetInfo,_std::allocator<cmGlobalGenerator::GlobalTargetInfo>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  globalTargets.
  super__Vector_base<cmGlobalGenerator::GlobalTargetInfo,_std::allocator<cmGlobalGenerator::GlobalTargetInfo>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  globalTargets.
  super__Vector_base<cmGlobalGenerator::GlobalTargetInfo,_std::allocator<cmGlobalGenerator::GlobalTargetInfo>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  CreateDefaultGlobalTargets(this,&globalTargets);
  puVar2 = (this->Makefiles).
           super__Vector_base<std::unique_ptr<cmMakefile,_std::default_delete<cmMakefile>_>,_std::allocator<std::unique_ptr<cmMakefile,_std::default_delete<cmMakefile>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  for (puVar11 = (this->Makefiles).
                 super__Vector_base<std::unique_ptr<cmMakefile,_std::default_delete<cmMakefile>_>,_std::allocator<std::unique_ptr<cmMakefile,_std::default_delete<cmMakefile>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
      pGVar5 = globalTargets.
               super__Vector_base<cmGlobalGenerator::GlobalTargetInfo,_std::allocator<cmGlobalGenerator::GlobalTargetInfo>_>
               ._M_impl.super__Vector_impl_data._M_finish,
      gti = globalTargets.
            super__Vector_base<cmGlobalGenerator::GlobalTargetInfo,_std::allocator<cmGlobalGenerator::GlobalTargetInfo>_>
            ._M_impl.super__Vector_impl_data._M_start, puVar11 != puVar2; puVar11 = puVar11 + 1) {
    for (; gti != pGVar5; gti = gti + 1) {
      CreateGlobalTarget(this,gti,(puVar11->_M_t).
                                  super___uniq_ptr_impl<cmMakefile,_std::default_delete<cmMakefile>_>
                                  ._M_t.
                                  super__Tuple_impl<0UL,_cmMakefile_*,_std::default_delete<cmMakefile>_>
                                  .super__Head_base<0UL,_cmMakefile_*,_false>._M_head_impl);
    }
  }
  std::
  vector<cmGlobalGenerator::GlobalTargetInfo,_std::allocator<cmGlobalGenerator::GlobalTargetInfo>_>
  ::~vector(&globalTargets);
  pcVar1 = this->CMakeInstance;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&globalTargets,"CMAKE_NUMBER_OF_MAKEFILES",&local_221);
  std::__cxx11::to_string
            (&local_220,
             (long)(this->Makefiles).
                   super__Vector_base<std::unique_ptr<cmMakefile,_std::default_delete<cmMakefile>_>,_std::allocator<std::unique_ptr<cmMakefile,_std::default_delete<cmMakefile>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish -
             (long)(this->Makefiles).
                   super__Vector_base<std::unique_ptr<cmMakefile,_std::default_delete<cmMakefile>_>,_std::allocator<std::unique_ptr<cmMakefile,_std::default_delete<cmMakefile>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start >> 3);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_1f8,"number of local generators",&local_222);
  cmake::AddCacheEntry(pcVar1,(string *)&globalTargets,&local_220,(string *)local_1f8,4);
  std::__cxx11::string::~string((string *)local_1f8);
  std::__cxx11::string::~string((string *)&local_220);
  std::__cxx11::string::~string((string *)&globalTargets);
  lVar9 = std::chrono::_V2::steady_clock::now();
  if (this->CMakeInstance->CurrentWorkingMode == NORMAL_MODE) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&globalTargets);
    bVar6 = cmSystemTools::GetErrorOccurredFlag();
    if (bVar6) {
      std::operator<<((ostream *)&globalTargets,"Configuring incomplete, errors occurred!");
    }
    else {
      poVar10 = std::operator<<((ostream *)&globalTargets,"Configuring done (");
      local_1d0 = (lVar9 - lVar7) / 1000000;
      pp_Var3 = poVar10->_vptr_basic_ostream;
      p_Var4 = pp_Var3[-3];
      *(uint *)(&poVar10->field_0x18 + (long)p_Var4) =
           *(uint *)(&poVar10->field_0x18 + (long)p_Var4) & 0xfffffefb | 4;
      *(undefined8 *)(&poVar10->field_0x8 + (long)pp_Var3[-3]) = 1;
      poVar10 = std::ostream::_M_insert<long_double>((longdouble)local_1d0 / (longdouble)1000.0);
      std::operator<<(poVar10,"s)");
    }
    pcVar1 = this->CMakeInstance;
    std::__cxx11::stringbuf::str();
    cmake::UpdateProgress(pcVar1,&local_220,-1.0);
    std::__cxx11::string::~string((string *)&local_220);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&globalTargets);
  }
  std::unique_ptr<cmMakefile,_std::default_delete<cmMakefile>_>::~unique_ptr(&dirMfu);
  return;
}

Assistant:

void cmGlobalGenerator::Configure()
{
  auto startTime = std::chrono::steady_clock::now();

  this->FirstTimeProgress = 0.0f;
  this->ClearGeneratorMembers();
  this->NextDeferId = 0;

  cmStateSnapshot snapshot = this->CMakeInstance->GetCurrentSnapshot();

  snapshot.GetDirectory().SetCurrentSource(
    this->CMakeInstance->GetHomeDirectory());
  snapshot.GetDirectory().SetCurrentBinary(
    this->CMakeInstance->GetHomeOutputDirectory());

  auto dirMfu = cm::make_unique<cmMakefile>(this, snapshot);
  auto* dirMf = dirMfu.get();
  this->Makefiles.push_back(std::move(dirMfu));
  dirMf->SetRecursionDepth(this->RecursionDepth);
  this->IndexMakefile(dirMf);

  this->BinaryDirectories.insert(
    this->CMakeInstance->GetHomeOutputDirectory());

  if (this->ExtraGenerator && !this->CMakeInstance->GetIsInTryCompile()) {
    this->CMakeInstance->IssueMessage(
      MessageType::DEPRECATION_WARNING,
      cmStrCat("Support for \"Extra Generators\" like\n  ",
               this->ExtraGenerator->GetName(),
               "\nis deprecated and will be removed from a future version "
               "of CMake.  IDEs may use the cmake-file-api(7) to view "
               "CMake-generated project build trees."));
  }

  // now do it
  this->ConfigureDoneCMP0026AndCMP0024 = false;
  dirMf->Configure();
  dirMf->EnforceDirectoryLevelRules();

  this->ConfigureDoneCMP0026AndCMP0024 = true;

  // Put a copy of each global target in every directory.
  {
    std::vector<GlobalTargetInfo> globalTargets;
    this->CreateDefaultGlobalTargets(globalTargets);

    for (const auto& mf : this->Makefiles) {
      for (GlobalTargetInfo const& globalTarget : globalTargets) {
        this->CreateGlobalTarget(globalTarget, mf.get());
      }
    }
  }

  // update the cache entry for the number of local generators, this is used
  // for progress
  this->GetCMakeInstance()->AddCacheEntry(
    "CMAKE_NUMBER_OF_MAKEFILES", std::to_string(this->Makefiles.size()),
    "number of local generators", cmStateEnums::INTERNAL);

  auto endTime = std::chrono::steady_clock::now();

  if (this->CMakeInstance->GetWorkingMode() == cmake::NORMAL_MODE) {
    std::ostringstream msg;
    if (cmSystemTools::GetErrorOccurredFlag()) {
      msg << "Configuring incomplete, errors occurred!";
    } else {
      auto ms = std::chrono::duration_cast<std::chrono::milliseconds>(
        endTime - startTime);
      msg << "Configuring done (" << std::fixed << std::setprecision(1)
          << ms.count() / 1000.0L << "s)";
    }
    this->CMakeInstance->UpdateProgress(msg.str(), -1);
  }
}